

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

unsigned_long stb_rand(void)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)stb__mt_index;
  if (0x137f < (uint)stb__mt_index) {
    if (stb__mt_index != 0x1380) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 * 0x7ff8a3ed + 0x2aa01d31;
        *(ulong *)((long)stb__mt_buffer + lVar2) = uVar3 * 0x10000 + (uVar3 >> 0x10) ^ 0x31415926;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x1380);
    }
    lVar2 = 0;
    do {
      uVar3 = 0x9908b0df;
      if ((stb__mt_buffer[lVar2 + 1] & 1) == 0) {
        uVar3 = 0;
      }
      stb__mt_buffer[lVar2] =
           uVar3 ^ stb__mt_buffer[lVar2 + 0x18d] ^
           (ulong)(((uint)stb__mt_buffer[lVar2 + 1] & 0x7ffffffe |
                   (uint)stb__mt_buffer[lVar2] & 0x80000000) >> 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xe3);
    lVar2 = 0;
    do {
      uVar3 = 0x9908b0df;
      if ((stb__mt_buffer[lVar2 + 0xe4] & 1) == 0) {
        uVar3 = 0;
      }
      stb__mt_buffer[lVar2 + 0xe3] =
           uVar3 ^ stb__mt_buffer[lVar2] ^
           (ulong)(((uint)stb__mt_buffer[lVar2 + 0xe4] & 0x7ffffffe |
                   (uint)stb__mt_buffer[lVar2 + 0xe3] & 0x80000000) >> 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x18c);
    uVar3 = 0;
    uVar1 = 0x9908b0df;
    if ((stb__mt_buffer[0] & 1) == 0) {
      uVar1 = uVar3;
    }
    stb__mt_buffer[0x26f] =
         uVar1 ^ stb__mt_buffer[0x18c] ^
         (ulong)(((uint)stb__mt_buffer[0] & 0x7ffffffe | (uint)stb__mt_buffer[0x26f] & 0x80000000)
                >> 1);
  }
  stb__mt_index = (int)uVar3 + 8;
  uVar3 = *(ulong *)((long)stb__mt_buffer + uVar3) >> 0xb ^ *(ulong *)((long)stb__mt_buffer + uVar3)
  ;
  uVar3 = ((uint)uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = ((uint)uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

unsigned long stb_rand()
{
   unsigned long * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned long s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned long)) {
      if (idx > STB__MT_LEN*sizeof(unsigned long))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned long);
   
   r = *(unsigned long *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}